

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBucket.h
# Opt level: O3

void __thiscall
CTSL::
HashBucket<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
clear(HashBucket<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
      *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  HashNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *pHVar2;
  pointer pcVar3;
  HashNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *pHVar4;
  unique_lock<std::shared_timed_mutex> lock;
  unique_lock<std::shared_timed_mutex> local_28;
  
  local_28._M_device = &this->mutex_;
  local_28._M_owns = false;
  std::unique_lock<std::shared_timed_mutex>::lock(&local_28);
  local_28._M_owns = true;
  pHVar4 = this->head;
  while (pHVar4 != (HashNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                    *)0x0) {
    pHVar2 = pHVar4->next;
    pcVar3 = (pHVar4->key)._M_dataplus._M_p;
    pHVar4->next = (HashNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                    *)0x0;
    paVar1 = &(pHVar4->key).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    operator_delete(pHVar4,0x30);
    pHVar4 = pHVar2;
  }
  this->head = (HashNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)0x0;
  std::unique_lock<std::shared_timed_mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void clear()
  {
    // Exclusive lock to enable single write in the bucket
    std::unique_lock lock(mutex_);
    HashNode<K, V> *prev = nullptr;
    HashNode<K, V> *node = head;
    while (node != nullptr)
    {
      prev = node;
      node = node->next;
      delete prev;
    }
    head = nullptr;
  }